

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O3

void start_input_pass(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_component_info *pjVar2;
  jpeg_error_mgr *pjVar3;
  JQUANT_TBL *__dest;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = cinfo->comps_in_scan;
  if (iVar7 == 1) {
    pjVar2 = cinfo->cur_comp_info[0];
    cinfo->MCUs_per_row = pjVar2->width_in_blocks;
    uVar5 = pjVar2->height_in_blocks;
    cinfo->MCU_rows_in_scan = uVar5;
    pjVar2->MCU_width = 1;
    pjVar2->MCU_height = 1;
    uVar4 = 1;
    pjVar2->MCU_blocks = 1;
    pjVar2->MCU_sample_width = pjVar2->DCT_h_scaled_size;
    pjVar2->last_col_width = 1;
    uVar5 = uVar5 % (uint)pjVar2->v_samp_factor;
    if (uVar5 == 0) {
      uVar5 = pjVar2->v_samp_factor;
    }
    pjVar2->last_row_height = uVar5;
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;
  }
  else {
    if (iVar7 - 5U < 0xfffffffc) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x1b;
      (pjVar3->msg_parm).i[0] = iVar7;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    lVar8 = jdiv_round_up((ulong)cinfo->image_width,
                          (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
    cinfo->MCUs_per_row = (JDIMENSION)lVar8;
    lVar8 = jdiv_round_up((ulong)cinfo->image_height,
                          (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
    cinfo->MCU_rows_in_scan = (JDIMENSION)lVar8;
    cinfo->blocks_in_MCU = 0;
    if (cinfo->comps_in_scan < 1) goto LAB_0010a195;
    lVar8 = 0;
    do {
      pjVar2 = cinfo->cur_comp_info[lVar8];
      uVar5 = pjVar2->h_samp_factor;
      uVar1 = pjVar2->v_samp_factor;
      pjVar2->MCU_width = uVar5;
      pjVar2->MCU_height = uVar1;
      iVar7 = uVar1 * uVar5;
      pjVar2->MCU_blocks = iVar7;
      pjVar2->MCU_sample_width = pjVar2->DCT_h_scaled_size * uVar5;
      uVar6 = pjVar2->width_in_blocks % uVar5;
      if (uVar6 == 0) {
        uVar6 = uVar5;
      }
      pjVar2->last_col_width = uVar6;
      uVar5 = (uint)((ulong)pjVar2->height_in_blocks % (ulong)uVar1);
      if (uVar5 == 0) {
        uVar5 = uVar1;
      }
      pjVar2->last_row_height = uVar5;
      if (10 < cinfo->blocks_in_MCU + iVar7) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0xe;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
      }
      if (0 < iVar7) {
        uVar5 = iVar7 + 1;
        do {
          iVar7 = cinfo->blocks_in_MCU;
          cinfo->blocks_in_MCU = iVar7 + 1;
          cinfo->MCU_membership[iVar7] = (int)lVar8;
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
      lVar8 = lVar8 + 1;
      uVar4 = (ulong)cinfo->comps_in_scan;
    } while (lVar8 < (long)uVar4);
    if (cinfo->comps_in_scan < 1) goto LAB_0010a195;
  }
  lVar8 = 0;
  do {
    pjVar2 = cinfo->cur_comp_info[lVar8];
    if (pjVar2->quant_table == (JQUANT_TBL *)0x0) {
      uVar5 = pjVar2->quant_tbl_no;
      if ((3 < (ulong)uVar5) || (cinfo->quant_tbl_ptrs[uVar5] == (JQUANT_TBL *)0x0)) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x36;
        (pjVar3->msg_parm).i[0] = uVar5;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      __dest = (JQUANT_TBL *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x84);
      memcpy(__dest,cinfo->quant_tbl_ptrs[(int)uVar5],0x84);
      pjVar2->quant_table = __dest;
      uVar4 = (ulong)(uint)cinfo->comps_in_scan;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 < (int)uVar4);
LAB_0010a195:
  (*cinfo->entropy->start_pass)(cinfo);
  (*cinfo->coef->start_input_pass)(cinfo);
  cinfo->inputctl->consume_input = cinfo->coef->consume_data;
  return;
}

Assistant:

METHODDEF(void)
start_input_pass (j_decompress_ptr cinfo)
{
  per_scan_setup(cinfo);
  latch_quant_tables(cinfo);
  (*cinfo->entropy->start_pass) (cinfo);
  (*cinfo->coef->start_input_pass) (cinfo);
  cinfo->inputctl->consume_input = cinfo->coef->consume_data;
}